

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cc
# Opt level: O0

void brotli::EstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  bool bVar1;
  unsigned_long *puVar2;
  double dVar3;
  double dVar4;
  double local_868;
  double lit_cost;
  size_t histo;
  size_t i_1;
  size_t i;
  size_t in_window;
  size_t window_half;
  size_t histogram [256];
  float *cost_local;
  uint8_t *data_local;
  size_t mask_local;
  size_t len_local;
  size_t pos_local;
  
  mask_local = len;
  len_local = pos;
  bVar1 = IsMostlyUTF8(data,pos,mask,len,0.75);
  if (bVar1) {
    EstimateBitCostsForLiteralsUTF8(len_local,mask_local,mask,data,cost);
  }
  else {
    memset(&window_half,0,0x800);
    in_window = 2000;
    puVar2 = std::min<unsigned_long>(&in_window,&mask_local);
    i = *puVar2;
    for (i_1 = 0; i_1 < i; i_1 = i_1 + 1) {
      histogram[(ulong)data[len_local + i_1 & mask] - 1] =
           histogram[(ulong)data[len_local + i_1 & mask] - 1] + 1;
    }
    for (histo = 0; histo < mask_local; histo = histo + 1) {
      if (in_window <= histo) {
        histogram[(ulong)data[(len_local + histo) - in_window & mask] - 1] =
             histogram[(ulong)data[(len_local + histo) - in_window & mask] - 1] - 1;
        i = i - 1;
      }
      if (histo + in_window < mask_local) {
        histogram[(ulong)data[len_local + histo + in_window & mask] - 1] =
             histogram[(ulong)data[len_local + histo + in_window & mask] - 1] + 1;
        i = i + 1;
      }
      lit_cost = (double)histogram[(ulong)data[len_local + histo & mask] - 1];
      if (lit_cost == 0.0) {
        lit_cost = 4.94065645841247e-324;
      }
      dVar3 = FastLog2(i);
      dVar4 = FastLog2((size_t)lit_cost);
      local_868 = (dVar3 - dVar4) + 0.029;
      if (local_868 < 1.0) {
        local_868 = local_868 * 0.5 + 0.5;
      }
      cost[histo] = (float)local_868;
    }
  }
  return;
}

Assistant:

void EstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                 const uint8_t *data, float *cost) {
  if (IsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  }
  size_t histogram[256] = { 0 };
  size_t window_half = 2000;
  size_t in_window = std::min(window_half, len);

  // Bootstrap histogram.
  for (size_t i = 0; i < in_window; ++i) {
    ++histogram[data[(pos + i) & mask]];
  }

  // Compute bit costs with sliding window.
  for (size_t i = 0; i < len; ++i) {
    if (i >= window_half) {
      // Remove a byte in the past.
      --histogram[data[(pos + i - window_half) & mask]];
      --in_window;
    }
    if (i + window_half < len) {
      // Add a byte in the future.
      ++histogram[data[(pos + i + window_half) & mask]];
      ++in_window;
    }
    size_t histo = histogram[data[(pos + i) & mask]];
    if (histo == 0) {
      histo = 1;
    }
    double lit_cost = FastLog2(in_window) - FastLog2(histo);
    lit_cost += 0.029;
    if (lit_cost < 1.0) {
      lit_cost *= 0.5;
      lit_cost += 0.5;
    }
    cost[i] = static_cast<float>(lit_cost);
  }
}